

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

void __thiscall PartsBupOutputter::~PartsBupOutputter(PartsBupOutputter *this)

{
  path *in_RDI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  *unaff_retaddr;
  PartsBupOutputter *in_stack_00000330;
  
  *(undefined ***)&in_RDI->_M_pathname = &PTR__PartsBupOutputter_0014bc98;
  writeJSON(in_stack_00000330);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::~vector(unaff_retaddr);
  Image::~Image((Image *)0x128a66);
  Image::~Image((Image *)0x128a77);
  Image::~Image((Image *)0x128a88);
  std::__cxx11::string::~string((string *)&in_RDI[3]._M_cmpts);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  std::__cxx11::string::~string((string *)&in_RDI[2]._M_pathname._M_string_length);
  std::filesystem::__cxx11::path::~path(in_RDI);
  std::filesystem::__cxx11::path::~path(in_RDI);
  BupOutputter::~BupOutputter((BupOutputter *)in_RDI);
  return;
}

Assistant:

~PartsBupOutputter() {
		writeJSON();
	}